

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

void __thiscall pegmatite::Context::restore(Context *this,ParsingState *st)

{
  ulong uVar1;
  pointer pPVar2;
  Index IVar3;
  Rule *pRVar4;
  Input *pIVar5;
  Index IVar6;
  int iVar7;
  int iVar8;
  ParseMatch *__cur;
  pointer pPVar9;
  pointer pPVar10;
  long lVar11;
  pointer pPVar12;
  pointer pPVar13;
  long lVar14;
  ulong uVar15;
  undefined8 *puVar16;
  _Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
  *this_00;
  ulong uVar18;
  long lVar19;
  ulong uVar17;
  
  iVar7 = (st->position).col;
  (this->position).line = (st->position).line;
  (this->position).col = iVar7;
  IVar3 = (st->position).it.idx;
  (this->position).it.buffer = (st->position).it.buffer;
  (this->position).it.idx = IVar3;
  uVar1 = st->matches;
  pPVar9 = (this->matches).
           super__Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pPVar10 = (this->matches).
            super__Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  lVar19 = (long)pPVar10 - (long)pPVar9;
  lVar14 = lVar19 >> 3;
  uVar15 = lVar14 * 0x6db6db6db6db6db7;
  lVar11 = uVar15 - uVar1;
  if (uVar1 <= uVar15) {
    if ((uVar1 <= uVar15 && lVar11 != 0) && (pPVar9 = pPVar9 + uVar1, pPVar10 != pPVar9)) {
      (this->matches).
      super__Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
      ._M_impl.super__Vector_impl_data._M_finish = pPVar9;
    }
  }
  else {
    uVar18 = uVar1 + lVar14 * -0x6db6db6db6db6db7;
    if (uVar18 != 0) {
      if ((ulong)(((long)(this->matches).
                         super__Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pPVar10 >> 3) *
                 0x6db6db6db6db6db7) < uVar18) {
        if (lVar14 * -0x6db6db6db6db6db7 + 0x249249249249249U < uVar18) {
          std::__throw_length_error("vector::_M_default_append");
        }
        uVar17 = uVar18;
        if (uVar18 <= uVar15 && uVar15 - uVar18 != 0) {
          uVar17 = uVar15;
        }
        this_00 = (_Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
                   *)(uVar17 + uVar15);
        if ((_Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
             *)0x249249249249248 < this_00) {
          this_00 = (_Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
                     *)0x249249249249249;
        }
        pPVar9 = std::
                 _Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
                 ::_M_allocate(this_00,0x6db6db6db6db6db7);
        puVar16 = (undefined8 *)((long)pPVar9 + lVar19 + 0x28);
        lVar11 = uVar15 - uVar1;
        do {
          puVar16[-4] = 0;
          puVar16[-3] = 0xffffffffffffffff;
          puVar16[-1] = 0;
          *puVar16 = 0xffffffffffffffff;
          puVar16 = puVar16 + 7;
          lVar11 = lVar11 + 1;
        } while (lVar11 != 0);
        pPVar2 = (this->matches).
                 super__Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pPVar10 = (this->matches).
                  super__Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pPVar12 = pPVar9;
        for (pPVar13 = pPVar10; pPVar13 != pPVar2; pPVar13 = pPVar13 + 1) {
          iVar7 = (pPVar13->source).finish.col;
          (pPVar12->source).finish.line = (pPVar13->source).finish.line;
          (pPVar12->source).finish.col = iVar7;
          pRVar4 = pPVar13->matched_rule;
          pIVar5 = (pPVar13->source).start.it.buffer;
          IVar3 = (pPVar13->source).start.it.idx;
          iVar7 = (pPVar13->source).start.line;
          iVar8 = (pPVar13->source).start.col;
          IVar6 = (pPVar13->source).finish.it.idx;
          (pPVar12->source).finish.it.buffer = (pPVar13->source).finish.it.buffer;
          (pPVar12->source).finish.it.idx = IVar6;
          (pPVar12->source).start.it.idx = IVar3;
          (pPVar12->source).start.line = iVar7;
          (pPVar12->source).start.col = iVar8;
          pPVar12->matched_rule = pRVar4;
          (pPVar12->source).start.it.buffer = pIVar5;
          pPVar12 = pPVar12 + 1;
        }
        if (pPVar10 != (pointer)0x0) {
          operator_delete(pPVar10,(long)(this->matches).
                                        super__Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)pPVar10);
        }
        (this->matches).
        super__Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
        ._M_impl.super__Vector_impl_data._M_start = pPVar9;
        (this->matches).
        super__Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (pointer)((long)pPVar9 + uVar18 * 0x38 + lVar19);
        (this->matches).
        super__Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = pPVar9 + (long)this_00;
      }
      else {
        do {
          (pPVar10->source).start.it.buffer = (Input *)0x0;
          (pPVar10->source).start.it.idx = 0xffffffffffffffff;
          (pPVar10->source).finish.it.buffer = (Input *)0x0;
          (pPVar10->source).finish.it.idx = 0xffffffffffffffff;
          pPVar10 = pPVar10 + 1;
          lVar11 = lVar11 + 1;
        } while (lVar11 != 0);
        (this->matches).
        super__Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
        ._M_impl.super__Vector_impl_data._M_finish = pPVar10;
      }
    }
  }
  return;
}

Assistant:

void restore(const ParsingState &st)
	{
		position = st.position;
		matches.resize(st.matches);
	}